

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

RPCHelpMan * listbanned(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff778;
  undefined8 in_stack_fffffffffffff780;
  undefined8 in_stack_fffffffffffff788;
  undefined8 in_stack_fffffffffffff790;
  _Manager_type in_stack_fffffffffffff798;
  undefined8 in_stack_fffffffffffff7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff7a8;
  pointer in_stack_fffffffffffff7b8;
  pointer pRVar2;
  pointer in_stack_fffffffffffff7c0;
  pointer pRVar3;
  pointer in_stack_fffffffffffff7c8;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff7d0;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff7f0;
  pointer pRVar8;
  pointer pRVar9;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff810;
  pointer pRVar11;
  pointer pRVar12;
  allocator<char> local_7c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_7c8;
  allocator<char> local_7a2;
  allocator<char> local_7a1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_7a0;
  allocator<char> local_782;
  allocator<char> local_781;
  vector<RPCResult,_std::allocator<RPCResult>_> local_780;
  allocator<char> local_762;
  allocator<char> local_761;
  RPCResults local_760;
  vector<RPCArg,_std::allocator<RPCArg>_> local_748;
  allocator<char> local_72a;
  allocator<char> local_729;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  char *local_648;
  size_type local_640;
  char local_638 [8];
  undefined8 uStack_630;
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  string local_568 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  RPCResult local_4a8 [4];
  RPCResult local_288;
  string local_200 [32];
  string local_1e0 [32];
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"listbanned",&local_729);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"\nList all manually banned IPs/Subnets.\n",&local_72a);
  local_748.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_748.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_748.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_761);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_762);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"",&local_781);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"",&local_782);
  std::__cxx11::string::string<std::allocator<char>>(local_4c8,"address",&local_7a1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4e8,"The IP/Subnet of the banned node",&local_7a2);
  local_7c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff780;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff790;
  description._M_string_length = in_stack_fffffffffffff7a0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  description.field_2 = in_stack_fffffffffffff7a8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff7c0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff7b8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff7c8;
  RPCResult::RPCResult(local_4a8,STR,m_key_name,description,inner,SUB81(local_4c8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_508,"ban_created",&local_7c9);
  std::operator+(&local_548,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_528,&local_548," the ban was created");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_fffffffffffff780;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff790;
  description_00._M_string_length = in_stack_fffffffffffff7a0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  description_00.field_2 = in_stack_fffffffffffff7a8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff7c0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff7b8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff7c8;
  RPCResult::RPCResult
            (local_4a8 + 1,NUM_TIME,m_key_name_00,description_00,inner_00,SUB81(local_508,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_568,"banned_until",(allocator<char> *)&stack0xfffffffffffff817);
  std::operator+(&local_5a8,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_588,&local_5a8," the ban expires");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_fffffffffffff780;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff790;
  description_01._M_string_length = in_stack_fffffffffffff7a0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  description_01.field_2 = in_stack_fffffffffffff7a8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff7c0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff7b8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff7c8;
  RPCResult::RPCResult
            (local_4a8 + 2,NUM_TIME,m_key_name_01,description_01,inner_01,SUB81(local_568,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c8,"ban_duration",(allocator<char> *)&stack0xfffffffffffff7f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e8,"The ban duration, in seconds",(allocator<char> *)&stack0xfffffffffffff7f6);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_02._M_string_length = in_stack_fffffffffffff780;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff790;
  description_02._M_string_length = in_stack_fffffffffffff7a0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  description_02.field_2 = in_stack_fffffffffffff7a8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff7c0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff7b8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff7c8;
  RPCResult::RPCResult
            (local_4a8 + 3,NUM_TIME,m_key_name_02,description_02,inner_02,SUB81(local_5c8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_608,"time_remaining",(allocator<char> *)&stack0xfffffffffffff7d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_628,"The time remaining until the ban expires, in seconds",
             (allocator<char> *)&stack0xfffffffffffff7d6);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_03._M_string_length = in_stack_fffffffffffff780;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff790;
  description_03._M_string_length = in_stack_fffffffffffff7a0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  description_03.field_2._M_local_buf = in_stack_fffffffffffff7a8._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_288,NUM_TIME,m_key_name_03,description_03,inner_03,SUB81(local_608,0))
  ;
  __l._M_len = 5;
  __l._M_array = local_4a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_7a0,__l,(allocator_type *)&stack0xfffffffffffff7b7);
  m_key_name_04._M_string_length = in_stack_fffffffffffff780;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff790;
  description_04._M_string_length = in_stack_fffffffffffff7a0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  description_04.field_2._M_local_buf = in_stack_fffffffffffff7a8._M_local_buf;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_1c0,OBJ,m_key_name_04,description_04,inner_04,SUB81(local_1e0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_1c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_780,__l_00,(allocator_type *)&stack0xfffffffffffff7b6);
  m_key_name_05._M_string_length = in_stack_fffffffffffff780;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff790;
  description_05._M_string_length = in_stack_fffffffffffff7a0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  description_05.field_2 = in_stack_fffffffffffff7a8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_f8,ARR,m_key_name_05,description_05,inner_05,SUB81(local_118,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff780;
  result._0_8_ = in_stack_fffffffffffff778;
  result.m_key_name._M_string_length = in_stack_fffffffffffff788;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff790;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff798;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7a0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff7a8;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff7d0;
  result.m_description.field_2._8_8_ = pRVar5;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar6;
  result.m_cond._M_string_length = (size_type)pRVar7;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff7f0;
  result.m_cond.field_2._8_8_ = pRVar8;
  RPCResults::RPCResults(&local_760,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"listbanned",(allocator<char> *)&stack0xfffffffffffff7b5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"",(allocator<char> *)&stack0xfffffffffffff7b4);
  HelpExampleCli(&local_688,&local_6a8,&local_6c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"listbanned",(allocator<char> *)&stack0xfffffffffffff7b3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"",(allocator<char> *)&stack0xfffffffffffff7b2);
  HelpExampleRpc(&local_6e8,&local_708,&local_728);
  std::operator+(&local_668,&local_688,&local_6e8);
  local_648 = local_638;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p == &local_668.field_2) {
    uStack_630 = local_668.field_2._8_8_;
  }
  else {
    local_648 = local_668._M_dataplus._M_p;
  }
  local_640 = local_668._M_string_length;
  local_668._M_string_length = 0;
  local_668.field_2._M_local_buf[0] = '\0';
  description_06._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/net.cpp:830:9)>
       ::_M_invoke;
  description_06._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/net.cpp:830:9)>
                ::_M_manager;
  description_06.field_2 = in_stack_fffffffffffff7a8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7d0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._M_string_length = in_stack_fffffffffffff7f0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar8;
  examples.m_examples.field_2._8_8_ = pRVar9;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff810;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar10;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar11;
  fun._M_invoker = (_Invoker_type)pRVar12;
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff780,&stack0xfffffffffffff788)),
             description_06,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff788);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_760.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_780);
  RPCResult::~RPCResult(&local_1c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_7a0);
  lVar1 = 0x220;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_4a8[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7b8);
  std::__cxx11::string::~string(local_628);
  std::__cxx11::string::~string(local_608);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7d8);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::string::~string(local_5c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7f8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string(local_568);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff818);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string(local_508);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_7c8);
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string(local_4c8);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_748);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan listbanned()
{
    return RPCHelpMan{"listbanned",
                "\nList all manually banned IPs/Subnets.\n",
                {},
        RPCResult{RPCResult::Type::ARR, "", "",
            {
                {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "address", "The IP/Subnet of the banned node"},
                        {RPCResult::Type::NUM_TIME, "ban_created", "The " + UNIX_EPOCH_TIME + " the ban was created"},
                        {RPCResult::Type::NUM_TIME, "banned_until", "The " + UNIX_EPOCH_TIME + " the ban expires"},
                        {RPCResult::Type::NUM_TIME, "ban_duration", "The ban duration, in seconds"},
                        {RPCResult::Type::NUM_TIME, "time_remaining", "The time remaining until the ban expires, in seconds"},
                    }},
            }},
                RPCExamples{
                    HelpExampleCli("listbanned", "")
                            + HelpExampleRpc("listbanned", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    BanMan& banman = EnsureAnyBanman(request.context);

    banmap_t banMap;
    banman.GetBanned(banMap);
    const int64_t current_time{GetTime()};

    UniValue bannedAddresses(UniValue::VARR);
    for (const auto& entry : banMap)
    {
        const CBanEntry& banEntry = entry.second;
        UniValue rec(UniValue::VOBJ);
        rec.pushKV("address", entry.first.ToString());
        rec.pushKV("ban_created", banEntry.nCreateTime);
        rec.pushKV("banned_until", banEntry.nBanUntil);
        rec.pushKV("ban_duration", (banEntry.nBanUntil - banEntry.nCreateTime));
        rec.pushKV("time_remaining", (banEntry.nBanUntil - current_time));

        bannedAddresses.push_back(std::move(rec));
    }

    return bannedAddresses;
},
    };
}